

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

void P_Thing_SetVelocity(AActor *actor,DVector3 *vec,bool add,bool setbob)

{
  double dVar1;
  player_t *ppVar2;
  
  if (actor != (AActor *)0x0) {
    if (!add) {
      (actor->Vel).X = 0.0;
      (actor->Vel).Y = 0.0;
      (actor->Vel).Z = 0.0;
      ppVar2 = actor->player;
      if (ppVar2 != (player_t *)0x0) {
        (ppVar2->Vel).X = 0.0;
        (ppVar2->Vel).Y = 0.0;
      }
    }
    (actor->Vel).X = vec->X + (actor->Vel).X;
    (actor->Vel).Y = vec->Y + (actor->Vel).Y;
    (actor->Vel).Z = vec->Z + (actor->Vel).Z;
    if ((setbob) && (ppVar2 = actor->player, ppVar2 != (player_t *)0x0)) {
      dVar1 = vec->Y;
      (ppVar2->Vel).X = vec->X + (ppVar2->Vel).X;
      (ppVar2->Vel).Y = dVar1 + (ppVar2->Vel).Y;
    }
  }
  return;
}

Assistant:

void P_Thing_SetVelocity(AActor *actor, const DVector3 &vec, bool add, bool setbob)
{
	if (actor != NULL)
	{
		if (!add)
		{
			actor->Vel.Zero();
			if (actor->player != NULL) actor->player->Vel.Zero();
		}
		actor->Vel += vec;
		if (setbob && actor->player != NULL)
		{
			actor->player->Vel += vec.XY();
		}
	}
}